

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O3

void __thiscall ApprovalTests::Mac::MacDiffReporter::MacDiffReporter(MacDiffReporter *this)

{
  AraxisMergeReporter *this_00;
  BeyondCompareReporter *this_01;
  DiffMergeReporter *this_02;
  KaleidoscopeReporter *this_03;
  P4MergeReporter *this_04;
  SublimeMergeReporter *this_05;
  KDiff3Reporter *this_06;
  TkDiffReporter *this_07;
  VisualStudioCodeReporter *this_08;
  CLionDiffReporter *this_09;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_79;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_78;
  AraxisMergeReporter *local_60;
  BeyondCompareReporter *local_58;
  DiffMergeReporter *local_50;
  KaleidoscopeReporter *local_48;
  P4MergeReporter *local_40;
  SublimeMergeReporter *local_38;
  KDiff3Reporter *local_30;
  TkDiffReporter *local_28;
  VisualStudioCodeReporter *local_20;
  CLionDiffReporter *local_18;
  
  this_00 = (AraxisMergeReporter *)operator_new(0x70);
  AraxisMergeReporter::AraxisMergeReporter(this_00);
  local_60 = this_00;
  this_01 = (BeyondCompareReporter *)operator_new(0x70);
  BeyondCompareReporter::BeyondCompareReporter(this_01);
  local_58 = this_01;
  this_02 = (DiffMergeReporter *)operator_new(0x70);
  DiffMergeReporter::DiffMergeReporter(this_02);
  local_50 = this_02;
  this_03 = (KaleidoscopeReporter *)operator_new(0x70);
  KaleidoscopeReporter::KaleidoscopeReporter(this_03);
  local_48 = this_03;
  this_04 = (P4MergeReporter *)operator_new(0x70);
  P4MergeReporter::P4MergeReporter(this_04);
  local_40 = this_04;
  this_05 = (SublimeMergeReporter *)operator_new(0x70);
  SublimeMergeReporter::SublimeMergeReporter(this_05);
  local_38 = this_05;
  this_06 = (KDiff3Reporter *)operator_new(0x70);
  KDiff3Reporter::KDiff3Reporter(this_06);
  local_30 = this_06;
  this_07 = (TkDiffReporter *)operator_new(0x70);
  TkDiffReporter::TkDiffReporter(this_07);
  local_28 = this_07;
  this_08 = (VisualStudioCodeReporter *)operator_new(0x70);
  VisualStudioCodeReporter::VisualStudioCodeReporter(this_08);
  local_20 = this_08;
  this_09 = (CLionDiffReporter *)operator_new(0x70);
  CLionDiffReporter::CLionDiffReporter(this_09);
  __l._M_len = 10;
  __l._M_array = (iterator)&local_60;
  local_18 = this_09;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_78,__l,&local_79);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_78);
  if (local_78.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001b25e0;
  return;
}

Assistant:

MacDiffReporter::MacDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: mac_diff_reporters
                  new AraxisMergeReporter(),
                  new BeyondCompareReporter(),
                  new DiffMergeReporter(),
                  new KaleidoscopeReporter(),
                  new P4MergeReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter(),
                  new TkDiffReporter(),
                  new VisualStudioCodeReporter(),
                  new CLionDiffReporter()
                  // end-snippet
              })
        {
        }